

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiJittered.cpp
# Opt level: O2

void __thiscall pm::MultiJittered::generateSamples(MultiJittered *this)

{
  Random *this_00;
  pointer pVVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint i;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint i_1;
  uint uVar11;
  int iVar12;
  uint j_1;
  ulong uVar13;
  float fVar14;
  float fVar15;
  value_type local_38;
  
  uVar8 = (this->super_Sampler).numSamples_;
  uVar13 = (ulong)uVar8;
  local_38.x = 0.0;
  local_38.y = 0.0;
  for (uVar7 = 0; uVar2 = (this->super_Sampler).numSets_, uVar7 < uVar8 * uVar2; uVar7 = uVar7 + 1)
  {
    std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
              (&(this->super_Sampler).samples_,&local_38);
    uVar8 = (this->super_Sampler).numSamples_;
  }
  uVar4 = (ulong)SQRT((float)uVar13);
  fVar14 = 1.0 / (float)uVar13;
  this_00 = &(this->super_Sampler).rnd_;
  for (uVar8 = 0; uVar7 = (uint)uVar4, uVar8 < uVar2; uVar8 = uVar8 + 1) {
    uVar10 = 0;
    uVar2 = 0;
    while( true ) {
      uVar13 = uVar4 & 0xffffffff;
      uVar9 = uVar10;
      uVar11 = uVar2;
      if (uVar2 == uVar7) break;
      while (iVar12 = (int)uVar13, uVar13 = (ulong)(iVar12 - 1), iVar12 != 0) {
        fVar15 = Random::real(this_00);
        (this->super_Sampler).samples_.super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>
        ._M_impl.super__Vector_impl_data._M_start[(this->super_Sampler).numSamples_ * uVar8 + uVar9]
        .x = (float)uVar9 * fVar14 + fVar15 * fVar14;
        fVar15 = Random::real(this_00);
        (this->super_Sampler).samples_.super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>
        ._M_impl.super__Vector_impl_data._M_start[(this->super_Sampler).numSamples_ * uVar8 + uVar9]
        .y = (float)uVar11 * fVar14 + fVar15 * fVar14;
        uVar9 = uVar9 + 1;
        uVar11 = uVar11 + uVar7;
      }
      uVar2 = uVar2 + 1;
      uVar10 = uVar10 + uVar7;
    }
    uVar2 = (this->super_Sampler).numSets_;
  }
  for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
    iVar12 = 0;
    uVar2 = 0;
    while( true ) {
      if (uVar2 == uVar7) break;
      uVar9 = 0;
      uVar10 = uVar7;
      while (uVar10 = uVar10 - 1, uVar10 != 0xffffffff) {
        fVar15 = Random::real(this_00);
        iVar3 = (this->super_Sampler).numSamples_ * uVar8;
        uVar5 = iVar12 + uVar9 + iVar3;
        pVVar1 = (this->super_Sampler).samples_.
                 super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar14 = pVVar1[uVar5].x;
        uVar11 = iVar3 + uVar2 * uVar7 + (int)(long)((float)uVar10 * fVar15 + (float)uVar9);
        pVVar1[uVar5].x = pVVar1[uVar11].x;
        pVVar1[uVar11].x = fVar14;
        uVar9 = uVar9 + 1;
      }
      uVar2 = uVar2 + 1;
      iVar12 = iVar12 + uVar7;
    }
    uVar2 = (this->super_Sampler).numSets_;
  }
  for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
    for (uVar2 = 0; uVar2 != uVar7; uVar2 = uVar2 + 1) {
      uVar11 = 0;
      uVar9 = uVar2;
      uVar10 = uVar7;
      while (uVar10 = uVar10 - 1, uVar10 != 0xffffffff) {
        fVar15 = Random::real(this_00);
        iVar12 = (this->super_Sampler).numSamples_ * uVar8;
        uVar6 = iVar12 + uVar9;
        pVVar1 = (this->super_Sampler).samples_.
                 super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar14 = pVVar1[uVar6].y;
        uVar5 = (int)(long)((float)uVar10 * fVar15 + (float)uVar11) * uVar7 + iVar12 + uVar2;
        pVVar1[uVar6].y = pVVar1[uVar5].y;
        pVVar1[uVar5].y = fVar14;
        uVar11 = uVar11 + 1;
        uVar9 = uVar9 + uVar7;
      }
    }
    uVar2 = (this->super_Sampler).numSets_;
  }
  return;
}

Assistant:

void MultiJittered::generateSamples(void)
{
	// num_samples needs to be a perfect square
	const unsigned int n = static_cast<unsigned int>(sqrtf(static_cast<float>(numSamples_)));
	const float subcellWidth = 1.0f / static_cast<float>(numSamples_);

	// fill the samples array with dummy points to allow us to use the [ ] notation
	// when we set the initial patterns

	Vector2 fillPoint;
	for (unsigned int i = 0; i < numSamples_ * numSets_; i++)
		samples_.push_back(fillPoint);

	// distribute points in the initial patterns
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				samples_[i * n + j + p * numSamples_].x = (i * n + j) * subcellWidth + rnd_.real() * subcellWidth;
				samples_[i * n + j + p * numSamples_].y = (j * n + i) * subcellWidth + rnd_.real() * subcellWidth;
			}

	// shuffle x coordinates
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				// random integer between j and n - 1
				const unsigned int k = static_cast<unsigned int>(rnd_.real() * (n - 1 - j) + j);
				const float t = samples_[i * n + j + p * numSamples_].x;
				samples_[i * n + j + p * numSamples_].x = samples_[i * n + k + p * numSamples_].x;
				samples_[i * n + k + p * numSamples_].x = t;
			}

	// shuffle y coordinates
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				// random integer between j and n - 1
				const int unsigned k = static_cast<unsigned int>(rnd_.real() * (n - 1 - j) + j);
				const float t = samples_[j * n + i + p * numSamples_].y;
				samples_[j * n + i + p * numSamples_].y = samples_[k * n + i + p * numSamples_].y;
				samples_[k * n + i + p * numSamples_].y = t;
			}
}